

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O0

void __thiscall
Symbol_Table::set_function_data(Symbol_Table *this,string *name,string *kind,int n_args)

{
  int iVar1;
  bool bVar2;
  FunctionIdentifierData *this_00;
  mapped_type *ppFVar3;
  FunctionIdentifierData *identifier_data;
  int n_args_local;
  string *kind_local;
  string *name_local;
  Symbol_Table *this_local;
  
  this_00 = (FunctionIdentifierData *)operator_new(0x90);
  FunctionIdentifierData::FunctionIdentifierData(this_00);
  ppFVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionIdentifierData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FunctionIdentifierData_*>_>_>
            ::operator[](&this->functions,name);
  *ppFVar3 = this_00;
  bVar2 = std::operator==(kind,"method");
  if (bVar2) {
    iVar1 = this->method_count;
    this->method_count = iVar1 + 1;
    this_00->index = iVar1;
  }
  else {
    iVar1 = this->function_count;
    this->function_count = iVar1 + 1;
    this_00->index = iVar1;
  }
  this_00->n_args = n_args;
  std::__cxx11::string::operator=((string *)&this_00->kind,(string *)kind);
  return;
}

Assistant:

void Symbol_Table::set_function_data(const std::string& name, const std::string& kind, int n_args) {
    auto* identifier_data = new FunctionIdentifierData;
    functions[name] = identifier_data;

    if (kind == "method") {
        identifier_data->index = method_count++;
    }
    else {
        identifier_data->index = function_count++;
    }
    identifier_data->n_args = n_args;
    identifier_data->kind = kind;
}